

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::IssueMessage(cmMakefile *this,MessageType t,string *text)

{
  string *text_00;
  MessageType t_00;
  bool bVar1;
  const_reference ppcVar2;
  cmake *pcVar3;
  cmDebugger *pcVar4;
  cmListFileContext *pcVar5;
  cmDebugger *debugger;
  cmListFileBacktrace local_40;
  string *local_20;
  string *text_local;
  cmMakefile *pcStack_10;
  MessageType t_local;
  cmMakefile *this_local;
  
  local_20 = text;
  text_local._4_4_ = t;
  pcStack_10 = this;
  bVar1 = std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::empty
                    (&this->ExecutionStatusStack);
  if ((!bVar1) && ((text_local._4_4_ == FATAL_ERROR || (text_local._4_4_ == INTERNAL_ERROR)))) {
    ppcVar2 = std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::back
                        (&this->ExecutionStatusStack);
    cmExecutionStatus::SetNestedError(*ppcVar2);
  }
  pcVar3 = GetCMakeInstance(this);
  t_00 = text_local._4_4_;
  text_00 = local_20;
  GetBacktrace(&local_40,this);
  cmake::IssueMessage(pcVar3,t_00,text_00,&local_40);
  cmListFileBacktrace::~cmListFileBacktrace(&local_40);
  if ((text_local._4_4_ == FATAL_ERROR) || (text_local._4_4_ == INTERNAL_ERROR)) {
    pcVar3 = GetCMakeInstance(this);
    pcVar4 = cmake::GetDebugger(pcVar3);
    if (pcVar4 != (cmDebugger *)0x0) {
      pcVar5 = cmListFileBacktrace::Top(&this->Backtrace);
      (*pcVar4->_vptr_cmDebugger[0xd])(pcVar4,pcVar5);
    }
  }
  return;
}

Assistant:

void cmMakefile::IssueMessage(cmake::MessageType t,
                              std::string const& text) const
{
  if (!this->ExecutionStatusStack.empty()) {
    if ((t == cmake::FATAL_ERROR) || (t == cmake::INTERNAL_ERROR)) {
      this->ExecutionStatusStack.back()->SetNestedError();
    }
  }
  this->GetCMakeInstance()->IssueMessage(t, text, this->GetBacktrace());
  if ((t == cmake::FATAL_ERROR) || (t == cmake::INTERNAL_ERROR)) {
    if (auto debugger = this->GetCMakeInstance()->GetDebugger()) {
      debugger->ErrorHook(this->Backtrace.Top());
    }
  }
}